

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpphttplibconnector.hpp
# Opt level: O2

void __thiscall
CppHttpLibServerConnector::CppHttpLibServerConnector
          (CppHttpLibServerConnector *this,JsonRpcServer *server,int port)

{
  allocator<char> local_61;
  string local_60;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this->_vptr_CppHttpLibServerConnector = (_func_int **)&PTR__CppHttpLibServerConnector_0016c640;
  (this->thread)._M_id._M_thread = 0;
  this->server = server;
  httplib::Server::Server(&this->httpServer);
  this->port = port;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"/jsonrpc",&local_61);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/examples/cpphttplibconnector.hpp:31:7)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/examples/cpphttplibconnector.hpp:31:7)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  httplib::Server::Post(&this->httpServer,&local_60,(Handler *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

explicit CppHttpLibServerConnector(jsonrpccxx::JsonRpcServer &server, int port) :
    thread(),
    server(server),
    httpServer(),
    port(port) {
    httpServer.Post("/jsonrpc",
		    [this](const httplib::Request &req, httplib::Response &res) {
		      this->PostAction(req, res);
		    });
  }